

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vfloat<4> vVar9;
  byte bVar10;
  BVH *bvh;
  void *pvVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  vbool<4> vVar22;
  char cVar23;
  bool bVar24;
  uint uVar25;
  undefined4 uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  NodeRef root;
  size_t sVar31;
  size_t sVar32;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar33;
  NodeRef *pNVar34;
  undefined1 in_ZMM0 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vfloat4 a0;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar76;
  float fVar77;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar78;
  float fVar79;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar87;
  undefined1 auVar84 [64];
  float fVar88;
  float fVar91;
  float fVar92;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  undefined1 auVar95 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar101 [64];
  
  uVar21 = mm_lookupmask_ps._8_8_;
  uVar20 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar32 = (bvh->root).ptr;
  if (sVar32 != 8) {
    auVar41 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar99 = vpcmpeqd_avx(auVar41,(undefined1  [16])valid_i->field_0);
    auVar41 = *(undefined1 (*) [16])(ray + 0x80);
    auVar36 = ZEXT816(0) << 0x40;
    auVar42 = vcmpps_avx(auVar41,auVar36,5);
    auVar42 = vandps_avx(auVar42,auVar99);
    uVar28 = vmovmskps_avx(auVar42);
    if (uVar28 != 0) {
      uVar29 = (ulong)(uVar28 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar54._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar54._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar54._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar54._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar99 = vrsqrtps_avx(auVar54);
      fVar56 = auVar99._0_4_;
      fVar58 = auVar99._4_4_;
      fVar59 = auVar99._8_4_;
      fVar60 = auVar99._12_4_;
      pre.depth_scale.field_0.v[0] = fVar56 * 1.5 + fVar56 * fVar56 * fVar56 * auVar54._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] = fVar58 * 1.5 + fVar58 * fVar58 * fVar58 * auVar54._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar59 * 1.5 + fVar59 * fVar59 * fVar59 * auVar54._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar60 * 1.5 + fVar60 * fVar60 * fVar60 * auVar54._12_4_ * -0.5
      ;
      auVar99._8_4_ = 0x80000000;
      auVar99._0_8_ = 0x8000000080000000;
      auVar99._12_4_ = 0x80000000;
      auVar101 = ZEXT1664(auVar99);
      do {
        lVar30 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
          }
        }
        auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar30 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar30 * 4 + 0x50)),0x1c);
        auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + lVar30 * 4 + 0x60)),0x28);
        fVar56 = *(float *)((long)pre.ray_space + lVar30 * 4 + -0x10);
        auVar64._0_4_ = auVar54._0_4_ * fVar56;
        auVar64._4_4_ = auVar54._4_4_ * fVar56;
        auVar64._8_4_ = auVar54._8_4_ * fVar56;
        auVar64._12_4_ = auVar54._12_4_ * fVar56;
        auVar52 = vshufpd_avx(auVar64,auVar64,1);
        auVar54 = vmovshdup_avx(auVar64);
        auVar70._0_4_ = auVar54._0_4_ ^ 0x80000000;
        auVar54 = vunpckhps_avx(auVar64,auVar36);
        auVar70._4_12_ = ZEXT812(0) << 0x20;
        auVar67 = vshufps_avx(auVar54,auVar70,0x41);
        auVar66._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
        auVar66._8_8_ = auVar52._8_8_ ^ auVar99._8_8_;
        auVar66 = vinsertps_avx(auVar66,auVar64,0x2a);
        auVar54 = vdpps_avx(auVar67,auVar67,0x7f);
        auVar52 = vdpps_avx(auVar66,auVar66,0x7f);
        auVar54 = vcmpps_avx(auVar52,auVar54,1);
        auVar54 = vshufps_avx(auVar54,auVar54,0);
        auVar54 = vblendvps_avx(auVar66,auVar67,auVar54);
        auVar52 = vdpps_avx(auVar54,auVar54,0x7f);
        auVar66 = vrsqrtss_avx(auVar52,auVar52);
        fVar58 = auVar66._0_4_;
        auVar52 = ZEXT416((uint)(fVar58 * 1.5 - auVar52._0_4_ * 0.5 * fVar58 * fVar58 * fVar58));
        auVar52 = vshufps_avx(auVar52,auVar52,0);
        auVar67._0_4_ = auVar54._0_4_ * auVar52._0_4_;
        auVar67._4_4_ = auVar54._4_4_ * auVar52._4_4_;
        auVar67._8_4_ = auVar54._8_4_ * auVar52._8_4_;
        auVar67._12_4_ = auVar54._12_4_ * auVar52._12_4_;
        auVar54 = vshufps_avx(auVar67,auVar67,0xc9);
        auVar52 = vshufps_avx(auVar64,auVar64,0xc9);
        auVar80._0_4_ = auVar52._0_4_ * auVar67._0_4_;
        auVar80._4_4_ = auVar52._4_4_ * auVar67._4_4_;
        auVar80._8_4_ = auVar52._8_4_ * auVar67._8_4_;
        auVar80._12_4_ = auVar52._12_4_ * auVar67._12_4_;
        auVar71._0_4_ = auVar64._0_4_ * auVar54._0_4_;
        auVar71._4_4_ = auVar64._4_4_ * auVar54._4_4_;
        auVar71._8_4_ = auVar64._8_4_ * auVar54._8_4_;
        auVar71._12_4_ = auVar64._12_4_ * auVar54._12_4_;
        auVar54 = vsubps_avx(auVar71,auVar80);
        auVar66 = vshufps_avx(auVar54,auVar54,0xc9);
        auVar54 = vdpps_avx(auVar66,auVar66,0x7f);
        auVar52 = vrsqrtss_avx(auVar54,auVar54);
        fVar58 = auVar52._0_4_;
        auVar54 = ZEXT416((uint)(fVar58 * 1.5 - auVar54._0_4_ * 0.5 * fVar58 * fVar58 * fVar58));
        auVar54 = vshufps_avx(auVar54,auVar54,0);
        auVar72._0_4_ = auVar54._0_4_ * auVar66._0_4_;
        auVar72._4_4_ = auVar54._4_4_ * auVar66._4_4_;
        auVar72._8_4_ = auVar54._8_4_ * auVar66._8_4_;
        auVar72._12_4_ = auVar54._12_4_ * auVar66._12_4_;
        auVar52._0_4_ = auVar64._0_4_ * fVar56;
        auVar52._4_4_ = auVar64._4_4_ * fVar56;
        auVar52._8_4_ = auVar64._8_4_ * fVar56;
        auVar52._12_4_ = auVar64._12_4_ * fVar56;
        auVar66 = vunpcklps_avx(auVar67,auVar52);
        auVar54 = vunpckhps_avx(auVar67,auVar52);
        auVar67 = vunpcklps_avx(auVar72,auVar36);
        auVar52 = vunpckhps_avx(auVar72,auVar36);
        aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar54,auVar52);
        aVar14 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar66,auVar67);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar66,auVar67);
        pre.ray_space[lVar30].vx.field_0 = aVar14;
        pre.ray_space[lVar30].vy.field_0 = aVar12;
        pre.ray_space[lVar30].vz.field_0 = aVar13;
        uVar29 = uVar29 & uVar29 - 1;
      } while (uVar29 != 0);
      auVar68._8_4_ = 0x7fffffff;
      auVar68._0_8_ = 0x7fffffff7fffffff;
      auVar68._12_4_ = 0x7fffffff;
      auVar73._8_4_ = 0x219392ef;
      auVar73._0_8_ = 0x219392ef219392ef;
      auVar73._12_4_ = 0x219392ef;
      auVar99 = vandps_avx(auVar68,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar99 = vcmpps_avx(auVar99,auVar73,1);
      auVar99 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar73,auVar99);
      auVar81._8_4_ = 0x3f800000;
      auVar81._0_8_ = 0x3f8000003f800000;
      auVar81._12_4_ = 0x3f800000;
      auVar36 = vrcpps_avx(auVar99);
      fVar56 = auVar36._0_4_;
      auVar51._0_4_ = auVar99._0_4_ * fVar56;
      fVar58 = auVar36._4_4_;
      auVar51._4_4_ = auVar99._4_4_ * fVar58;
      fVar59 = auVar36._8_4_;
      auVar51._8_4_ = auVar99._8_4_ * fVar59;
      fVar60 = auVar36._12_4_;
      auVar51._12_4_ = auVar99._12_4_ * fVar60;
      auVar99 = vsubps_avx(auVar81,auVar51);
      tray.rdir.field_0._16_4_ = fVar56 + fVar56 * auVar99._0_4_;
      tray.rdir.field_0._20_4_ = fVar58 + fVar58 * auVar99._4_4_;
      tray.rdir.field_0._24_4_ = fVar59 + fVar59 * auVar99._8_4_;
      tray.rdir.field_0._28_4_ = fVar60 + fVar60 * auVar99._12_4_;
      auVar52 = ZEXT816(0) << 0x20;
      auVar99 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar52,5);
      auVar61._8_4_ = 0x20;
      auVar61._0_8_ = 0x2000000020;
      auVar61._12_4_ = 0x20;
      auVar65._8_4_ = 0x30;
      auVar65._0_8_ = 0x3000000030;
      auVar65._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar65,auVar61,auVar99);
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x20);
      auVar99 = vandps_avx(auVar68,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar99 = vcmpps_avx(auVar99,auVar73,1);
      auVar36 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar73,auVar99);
      auVar99 = vandps_avx(auVar68,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar99 = vcmpps_avx(auVar99,auVar73,1);
      auVar99 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar73,auVar99);
      auVar54 = vrcpps_avx(auVar36);
      fVar56 = auVar54._0_4_;
      auVar44._0_4_ = auVar36._0_4_ * fVar56;
      fVar58 = auVar54._4_4_;
      auVar44._4_4_ = auVar36._4_4_ * fVar58;
      fVar59 = auVar54._8_4_;
      auVar44._8_4_ = auVar36._8_4_ * fVar59;
      fVar60 = auVar54._12_4_;
      auVar44._12_4_ = auVar36._12_4_ * fVar60;
      auVar36 = vsubps_avx(auVar81,auVar44);
      tray.rdir.field_0._0_4_ = fVar56 + fVar56 * auVar36._0_4_;
      tray.rdir.field_0._4_4_ = fVar58 + fVar58 * auVar36._4_4_;
      tray.rdir.field_0._8_4_ = fVar59 + fVar59 * auVar36._8_4_;
      tray.rdir.field_0._12_4_ = fVar60 + fVar60 * auVar36._12_4_;
      auVar36 = vrcpps_avx(auVar99);
      fVar56 = auVar36._0_4_;
      auVar35._0_4_ = auVar99._0_4_ * fVar56;
      fVar58 = auVar36._4_4_;
      auVar35._4_4_ = auVar99._4_4_ * fVar58;
      fVar59 = auVar36._8_4_;
      auVar35._8_4_ = auVar99._8_4_ * fVar59;
      fVar60 = auVar36._12_4_;
      auVar35._12_4_ = auVar99._12_4_ * fVar60;
      auVar99 = vsubps_avx(auVar81,auVar35);
      tray.rdir.field_0._32_4_ = fVar56 + fVar56 * auVar99._0_4_;
      tray.rdir.field_0._36_4_ = fVar58 + fVar58 * auVar99._4_4_;
      tray.rdir.field_0._40_4_ = fVar59 + fVar59 * auVar99._8_4_;
      tray.rdir.field_0._44_4_ = fVar60 + fVar60 * auVar99._12_4_;
      auVar99 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar52,1);
      auVar48._8_4_ = 0x10;
      auVar48._0_8_ = 0x1000000010;
      auVar48._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar99,auVar48);
      auVar99 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar52,5);
      auVar45._8_4_ = 0x40;
      auVar45._0_8_ = 0x4000000040;
      auVar45._12_4_ = 0x40;
      auVar49._8_4_ = 0x50;
      auVar49._0_8_ = 0x5000000050;
      auVar49._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar49,auVar45,auVar99);
      auVar99 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar52);
      auVar41 = vmaxps_avx(auVar41,auVar52);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar84 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar99,auVar42);
      auVar36._8_4_ = 0xff800000;
      auVar36._0_8_ = 0xff800000ff800000;
      auVar36._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar36,auVar41,auVar42);
      auVar41 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0.i[1] = auVar42._4_4_ ^ auVar41._4_4_;
      terminated.field_0.i[0] = auVar42._0_4_ ^ auVar41._0_4_;
      terminated.field_0.i[2] = auVar42._8_4_ ^ auVar41._8_4_;
      terminated.field_0.i[3] = auVar42._12_4_ ^ auVar41._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar28 = 3;
      }
      else {
        uVar28 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar34 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar33 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar32;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_0030201b:
      do {
        do {
          root.ptr = pNVar34[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_003025eb;
          pNVar34 = pNVar34 + -1;
          paVar33 = paVar33 + -1;
          vVar9.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar33->v;
          auVar43 = ZEXT1664((undefined1  [16])vVar9.field_0);
          auVar41 = vcmpps_avx((undefined1  [16])vVar9.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar25 = vmovmskps_avx(auVar41);
        } while (uVar25 == 0);
        uVar29 = (ulong)(uVar25 & 0xff);
        uVar25 = POPCOUNT(uVar25 & 0xff);
        if (uVar28 < uVar25) {
LAB_00302059:
          do {
            vVar22.field_0 = terminated.field_0;
            iVar27 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_003025eb;
              auVar41 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar43._0_16_,6);
              if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar41[0xf] < '\0') {
                bVar10 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar11 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar21;
                valid_o.field_0._0_8_ = uVar20;
                uVar25 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                if ((uVar25 ^ 0xf) != 0) {
                  uVar29 = (ulong)((uVar25 ^ 0xf) & 0xff);
                  do {
                    lVar30 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                      }
                    }
                    cVar23 = (**(code **)((long)pvVar11 + (ulong)bVar10 * 0x40 + 0x18))
                                       (&pre,ray,lVar30,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar23 != '\0') {
                      valid_o.field_0.i[lVar30] = -1;
                    }
                    uVar29 = uVar29 & uVar29 - 1;
                  } while (uVar29 != 0);
                  auVar101 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)))
                  ;
                  auVar84 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])valid_o.field_0,(undefined1  [16])vVar22.field_0);
                auVar41 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar41[0xf]) goto LAB_003025eb;
                auVar47._8_4_ = 0xff800000;
                auVar47._0_8_ = 0xff800000ff800000;
                auVar47._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar47,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_0030201b;
            }
            uVar29 = root.ptr & 0xfffffffffffffff0;
            auVar41 = auVar84._0_16_;
            lVar30 = 0x1c;
            sVar32 = 8;
            auVar102 = auVar101;
            do {
              sVar31 = *(size_t *)((uVar29 - 0xe0) + lVar30 * 8);
              auVar101 = auVar102;
              if (sVar31 == 8) {
                auVar43 = ZEXT1664(auVar41);
                sVar31 = sVar32;
                break;
              }
              if ((root.ptr & 7) == 0) {
                uVar26 = *(undefined4 *)((root.ptr - 0x50) + lVar30 * 4);
                auVar37._4_4_ = uVar26;
                auVar37._0_4_ = uVar26;
                auVar37._8_4_ = uVar26;
                auVar37._12_4_ = uVar26;
                auVar18._4_4_ = tray.org.field_0._4_4_;
                auVar18._0_4_ = tray.org.field_0._0_4_;
                auVar18._8_4_ = tray.org.field_0._8_4_;
                auVar18._12_4_ = tray.org.field_0._12_4_;
                auVar19._8_8_ = tray.org.field_0._24_8_;
                auVar19._0_8_ = tray.org.field_0._16_8_;
                auVar99 = vsubps_avx(auVar37,auVar18);
                auVar50._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar99._0_4_;
                auVar50._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar99._4_4_;
                auVar50._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar99._8_4_;
                auVar50._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar99._12_4_;
                uVar26 = *(undefined4 *)((root.ptr - 0x30) + lVar30 * 4);
                auVar38._4_4_ = uVar26;
                auVar38._0_4_ = uVar26;
                auVar38._8_4_ = uVar26;
                auVar38._12_4_ = uVar26;
                auVar99 = vsubps_avx(auVar38,auVar19);
                auVar46._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar99._0_4_;
                auVar46._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar99._4_4_;
                auVar46._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar99._8_4_;
                auVar46._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar99._12_4_;
                uVar26 = *(undefined4 *)((root.ptr - 0x10) + lVar30 * 4);
                auVar39._4_4_ = uVar26;
                auVar39._0_4_ = uVar26;
                auVar39._8_4_ = uVar26;
                auVar39._12_4_ = uVar26;
                auVar99 = vsubps_avx(auVar39,(undefined1  [16])tray.org.field_0.field_0.z.field_0);
                auVar40._0_4_ = tray.rdir.field_0._32_4_ * auVar99._0_4_;
                auVar40._4_4_ = tray.rdir.field_0._36_4_ * auVar99._4_4_;
                auVar40._8_4_ = tray.rdir.field_0._40_4_ * auVar99._8_4_;
                auVar40._12_4_ = tray.rdir.field_0._44_4_ * auVar99._12_4_;
                uVar26 = *(undefined4 *)((root.ptr - 0x40) + lVar30 * 4);
                auVar74._4_4_ = uVar26;
                auVar74._0_4_ = uVar26;
                auVar74._8_4_ = uVar26;
                auVar74._12_4_ = uVar26;
                auVar99 = vsubps_avx(auVar74,auVar18);
                auVar53._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar99._0_4_;
                auVar53._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar99._4_4_;
                auVar53._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar99._8_4_;
                auVar53._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar99._12_4_;
                uVar26 = *(undefined4 *)((root.ptr - 0x20) + lVar30 * 4);
                auVar62._4_4_ = uVar26;
                auVar62._0_4_ = uVar26;
                auVar62._8_4_ = uVar26;
                auVar62._12_4_ = uVar26;
                auVar99 = vsubps_avx(auVar62,auVar19);
                auVar55._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar99._0_4_;
                auVar55._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar99._4_4_;
                auVar55._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar99._8_4_;
                auVar55._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar99._12_4_;
                uVar26 = *(undefined4 *)(root.ptr + lVar30 * 4);
                auVar63._4_4_ = uVar26;
                auVar63._0_4_ = uVar26;
                auVar63._8_4_ = uVar26;
                auVar63._12_4_ = uVar26;
                auVar99 = vsubps_avx(auVar63,(undefined1  [16])tray.org.field_0.field_0.z.field_0);
                auVar57._0_4_ = tray.rdir.field_0._32_4_ * auVar99._0_4_;
                auVar57._4_4_ = tray.rdir.field_0._36_4_ * auVar99._4_4_;
                auVar57._8_4_ = tray.rdir.field_0._40_4_ * auVar99._8_4_;
                auVar57._12_4_ = tray.rdir.field_0._44_4_ * auVar99._12_4_;
              }
              else {
                fVar56 = *(float *)((uVar29 - 0x50) + lVar30 * 4);
                fVar58 = *(float *)((uVar29 - 0x40) + lVar30 * 4);
                fVar59 = *(float *)((uVar29 - 0x30) + lVar30 * 4);
                fVar60 = *(float *)((uVar29 - 0x20) + lVar30 * 4);
                fVar1 = *(float *)((uVar29 - 0x10) + lVar30 * 4);
                fVar2 = *(float *)(uVar29 + lVar30 * 4);
                fVar3 = *(float *)(uVar29 + 0x10 + lVar30 * 4);
                fVar4 = *(float *)(uVar29 + 0x20 + lVar30 * 4);
                fVar5 = *(float *)(uVar29 + 0x30 + lVar30 * 4);
                auVar82._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar56 +
                     (float)tray.dir.field_0._16_4_ * fVar60 +
                     fVar3 * (float)tray.dir.field_0._32_4_;
                auVar82._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar56 +
                     (float)tray.dir.field_0._20_4_ * fVar60 +
                     fVar3 * (float)tray.dir.field_0._36_4_;
                auVar82._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar56 +
                     (float)tray.dir.field_0._24_4_ * fVar60 +
                     fVar3 * (float)tray.dir.field_0._40_4_;
                auVar82._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar56 +
                     (float)tray.dir.field_0._28_4_ * fVar60 +
                     fVar3 * (float)tray.dir.field_0._44_4_;
                auVar89._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar58 +
                     (float)tray.dir.field_0._16_4_ * fVar1 + fVar4 * (float)tray.dir.field_0._32_4_
                ;
                auVar89._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar58 +
                     (float)tray.dir.field_0._20_4_ * fVar1 + fVar4 * (float)tray.dir.field_0._36_4_
                ;
                auVar89._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar58 +
                     (float)tray.dir.field_0._24_4_ * fVar1 + fVar4 * (float)tray.dir.field_0._40_4_
                ;
                auVar89._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar58 +
                     (float)tray.dir.field_0._28_4_ * fVar1 + fVar4 * (float)tray.dir.field_0._44_4_
                ;
                auVar75._0_4_ =
                     fVar59 * (float)tray.dir.field_0._0_4_ +
                     (float)tray.dir.field_0._16_4_ * fVar2 + (float)tray.dir.field_0._32_4_ * fVar5
                ;
                auVar75._4_4_ =
                     fVar59 * (float)tray.dir.field_0._4_4_ +
                     (float)tray.dir.field_0._20_4_ * fVar2 + (float)tray.dir.field_0._36_4_ * fVar5
                ;
                auVar75._8_4_ =
                     fVar59 * (float)tray.dir.field_0._8_4_ +
                     (float)tray.dir.field_0._24_4_ * fVar2 + (float)tray.dir.field_0._40_4_ * fVar5
                ;
                auVar75._12_4_ =
                     fVar59 * (float)tray.dir.field_0._12_4_ +
                     (float)tray.dir.field_0._28_4_ * fVar2 + (float)tray.dir.field_0._44_4_ * fVar5
                ;
                auVar100._8_4_ = 0x7fffffff;
                auVar100._0_8_ = 0x7fffffff7fffffff;
                auVar100._12_4_ = 0x7fffffff;
                auVar99 = vandps_avx(auVar82,auVar100);
                auVar103._8_4_ = 0x219392ef;
                auVar103._0_8_ = 0x219392ef219392ef;
                auVar103._12_4_ = 0x219392ef;
                auVar99 = vcmpps_avx(auVar99,auVar103,1);
                auVar36 = vblendvps_avx(auVar82,auVar103,auVar99);
                auVar99 = vandps_avx(auVar89,auVar100);
                auVar99 = vcmpps_avx(auVar99,auVar103,1);
                auVar54 = vblendvps_avx(auVar89,auVar103,auVar99);
                auVar99 = vandps_avx(auVar75,auVar100);
                auVar99 = vcmpps_avx(auVar99,auVar103,1);
                auVar99 = vblendvps_avx(auVar75,auVar103,auVar99);
                fVar6 = *(float *)(uVar29 + 0x40 + lVar30 * 4);
                auVar52 = vrcpps_avx(auVar36);
                fVar69 = auVar52._0_4_;
                auVar83._0_4_ = fVar69 * auVar36._0_4_;
                fVar76 = auVar52._4_4_;
                auVar83._4_4_ = fVar76 * auVar36._4_4_;
                fVar77 = auVar52._8_4_;
                auVar83._8_4_ = fVar77 * auVar36._8_4_;
                fVar78 = auVar52._12_4_;
                auVar83._12_4_ = fVar78 * auVar36._12_4_;
                auVar104._8_4_ = 0x3f800000;
                auVar104._0_8_ = 0x3f8000003f800000;
                auVar104._12_4_ = 0x3f800000;
                auVar36 = vsubps_avx(auVar104,auVar83);
                fVar69 = fVar69 + fVar69 * auVar36._0_4_;
                fVar76 = fVar76 + fVar76 * auVar36._4_4_;
                fVar77 = fVar77 + fVar77 * auVar36._8_4_;
                fVar78 = fVar78 + fVar78 * auVar36._12_4_;
                auVar36 = vrcpps_avx(auVar54);
                fVar79 = auVar36._0_4_;
                auVar90._0_4_ = fVar79 * auVar54._0_4_;
                fVar85 = auVar36._4_4_;
                auVar90._4_4_ = fVar85 * auVar54._4_4_;
                fVar86 = auVar36._8_4_;
                auVar90._8_4_ = fVar86 * auVar54._8_4_;
                fVar87 = auVar36._12_4_;
                auVar90._12_4_ = fVar87 * auVar54._12_4_;
                auVar36 = vsubps_avx(auVar104,auVar90);
                fVar79 = fVar79 + fVar79 * auVar36._0_4_;
                fVar85 = fVar85 + fVar85 * auVar36._4_4_;
                fVar86 = fVar86 + fVar86 * auVar36._8_4_;
                fVar87 = fVar87 + fVar87 * auVar36._12_4_;
                auVar36 = vrcpps_avx(auVar99);
                fVar88 = auVar36._0_4_;
                auVar95._0_4_ = fVar88 * auVar99._0_4_;
                fVar91 = auVar36._4_4_;
                auVar95._4_4_ = fVar91 * auVar99._4_4_;
                fVar92 = auVar36._8_4_;
                auVar95._8_4_ = fVar92 * auVar99._8_4_;
                fVar93 = auVar36._12_4_;
                auVar95._12_4_ = fVar93 * auVar99._12_4_;
                auVar99 = vsubps_avx(auVar104,auVar95);
                fVar88 = fVar88 + fVar88 * auVar99._0_4_;
                fVar91 = fVar91 + fVar91 * auVar99._4_4_;
                fVar92 = fVar92 + fVar92 * auVar99._8_4_;
                fVar93 = fVar93 + fVar93 * auVar99._12_4_;
                fVar7 = *(float *)(uVar29 + 0x50 + lVar30 * 4);
                auVar101 = ZEXT1664(auVar102._0_16_);
                fVar8 = *(float *)(uVar29 + 0x60 + lVar30 * 4);
                fVar94 = (float)tray.org.field_0._16_8_;
                fVar96 = (float)((ulong)tray.org.field_0._16_8_ >> 0x20);
                fVar97 = (float)tray.org.field_0._24_8_;
                fVar98 = (float)((ulong)tray.org.field_0._24_8_ >> 0x20);
                uVar25 = auVar102._0_4_;
                uVar15 = auVar102._4_4_;
                uVar16 = auVar102._8_4_;
                uVar17 = auVar102._12_4_;
                auVar50._0_4_ =
                     (fVar56 * (float)tray.org.field_0._0_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._32_4_ + fVar94 * fVar60) *
                     (float)((uint)fVar69 ^ uVar25);
                auVar50._4_4_ =
                     (fVar56 * (float)tray.org.field_0._4_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._36_4_ + fVar96 * fVar60) *
                     (float)((uint)fVar76 ^ uVar15);
                auVar50._8_4_ =
                     (fVar56 * (float)tray.org.field_0._8_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._40_4_ + fVar97 * fVar60) *
                     (float)((uint)fVar77 ^ uVar16);
                auVar50._12_4_ =
                     (fVar56 * (float)tray.org.field_0._12_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._44_4_ + fVar98 * fVar60) *
                     (float)((uint)fVar78 ^ uVar17);
                auVar46._0_4_ =
                     (fVar58 * (float)tray.org.field_0._0_4_ +
                     fVar7 + fVar4 * (float)tray.org.field_0._32_4_ + fVar94 * fVar1) *
                     (float)((uint)fVar79 ^ uVar25);
                auVar46._4_4_ =
                     (fVar58 * (float)tray.org.field_0._4_4_ +
                     fVar7 + fVar4 * (float)tray.org.field_0._36_4_ + fVar96 * fVar1) *
                     (float)((uint)fVar85 ^ uVar15);
                auVar46._8_4_ =
                     (fVar58 * (float)tray.org.field_0._8_4_ +
                     fVar7 + fVar4 * (float)tray.org.field_0._40_4_ + fVar97 * fVar1) *
                     (float)((uint)fVar86 ^ uVar16);
                auVar46._12_4_ =
                     (fVar58 * (float)tray.org.field_0._12_4_ +
                     fVar7 + fVar4 * (float)tray.org.field_0._44_4_ + fVar98 * fVar1) *
                     (float)((uint)fVar87 ^ uVar17);
                auVar40._0_4_ =
                     ((float)tray.org.field_0._0_4_ * fVar59 +
                     fVar94 * fVar2 + fVar8 + (float)tray.org.field_0._32_4_ * fVar5) *
                     (float)((uint)fVar88 ^ uVar25);
                auVar40._4_4_ =
                     ((float)tray.org.field_0._4_4_ * fVar59 +
                     fVar96 * fVar2 + fVar8 + (float)tray.org.field_0._36_4_ * fVar5) *
                     (float)((uint)fVar91 ^ uVar15);
                auVar40._8_4_ =
                     ((float)tray.org.field_0._8_4_ * fVar59 +
                     fVar97 * fVar2 + fVar8 + (float)tray.org.field_0._40_4_ * fVar5) *
                     (float)((uint)fVar92 ^ uVar16);
                auVar40._12_4_ =
                     ((float)tray.org.field_0._12_4_ * fVar59 +
                     fVar98 * fVar2 + fVar8 + (float)tray.org.field_0._44_4_ * fVar5) *
                     (float)((uint)fVar93 ^ uVar17);
                auVar53._0_4_ = fVar69 + auVar50._0_4_;
                auVar53._4_4_ = fVar76 + auVar50._4_4_;
                auVar53._8_4_ = fVar77 + auVar50._8_4_;
                auVar53._12_4_ = fVar78 + auVar50._12_4_;
                auVar55._0_4_ = fVar79 + auVar46._0_4_;
                auVar55._4_4_ = fVar85 + auVar46._4_4_;
                auVar55._8_4_ = fVar86 + auVar46._8_4_;
                auVar55._12_4_ = fVar87 + auVar46._12_4_;
                auVar84 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar57._0_4_ = fVar88 + auVar40._0_4_;
                auVar57._4_4_ = fVar91 + auVar40._4_4_;
                auVar57._8_4_ = fVar92 + auVar40._8_4_;
                auVar57._12_4_ = fVar93 + auVar40._12_4_;
              }
              auVar99 = vpminsd_avx(auVar50,auVar53);
              auVar36 = vpminsd_avx(auVar46,auVar55);
              auVar99 = vpmaxsd_avx(auVar99,auVar36);
              auVar36 = vpminsd_avx(auVar40,auVar57);
              auVar36 = vpmaxsd_avx(auVar99,auVar36);
              auVar99 = vpmaxsd_avx(auVar50,auVar53);
              auVar54 = vpmaxsd_avx(auVar46,auVar55);
              auVar54 = vpminsd_avx(auVar99,auVar54);
              auVar99 = vpmaxsd_avx(auVar40,auVar57);
              auVar54 = vpminsd_avx(auVar54,auVar99);
              auVar99 = vpmaxsd_avx(auVar36,(undefined1  [16])tray.tnear.field_0);
              auVar54 = vpminsd_avx(auVar54,(undefined1  [16])tray.tfar.field_0);
              auVar99 = vcmpps_avx(auVar99,auVar54,2);
              if ((((auVar99 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar99 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar99 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar99[0xf]) {
                auVar43 = ZEXT1664(auVar41);
                sVar31 = sVar32;
              }
              else {
                auVar99 = vblendvps_avx(auVar84._0_16_,auVar36,auVar99);
                auVar43 = ZEXT1664(auVar99);
                if (sVar32 != 8) {
                  pNVar34->ptr = sVar32;
                  pNVar34 = pNVar34 + 1;
                  *(undefined1 (*) [16])paVar33->v = auVar41;
                  paVar33 = paVar33 + 1;
                }
              }
              lVar30 = lVar30 + 1;
              auVar41 = auVar43._0_16_;
              sVar32 = sVar31;
              auVar102 = auVar101;
            } while (lVar30 != 0x20);
            if (sVar31 == 8) goto LAB_003023ee;
            auVar41 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar43._0_16_,6);
            uVar26 = vmovmskps_avx(auVar41);
            root.ptr = sVar31;
          } while ((byte)uVar28 < (byte)POPCOUNT(uVar26));
          pNVar34->ptr = sVar31;
          pNVar34 = pNVar34 + 1;
          *paVar33 = auVar43._0_16_;
          paVar33 = paVar33 + 1;
        }
        else {
          do {
            sVar32 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> sVar32 & 1) == 0; sVar32 = sVar32 + 1) {
              }
            }
            bVar24 = occluded1(This,bvh,root,sVar32,&pre,ray,&tray,context);
            if (bVar24) {
              terminated.field_0.i[sVar32] = -1;
            }
            uVar29 = uVar29 & uVar29 - 1;
          } while (uVar29 != 0);
          auVar41 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar27 = 3;
          if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar41[0xf] < '\0') {
            auVar41._8_4_ = 0xff800000;
            auVar41._0_8_ = 0xff800000ff800000;
            auVar41._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar41,
                               (undefined1  [16])terminated.field_0);
            iVar27 = 2;
          }
          auVar101 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar84 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar43 = ZEXT1664((undefined1  [16])vVar9.field_0);
          if (uVar28 < uVar25) goto LAB_00302059;
        }
LAB_003023ee:
      } while (iVar27 != 3);
LAB_003025eb:
      auVar41 = vandps_avx(auVar42,(undefined1  [16])terminated.field_0);
      auVar42._8_4_ = 0xff800000;
      auVar42._0_8_ = 0xff800000ff800000;
      auVar42._12_4_ = 0xff800000;
      auVar41 = vmaskmovps_avx(auVar41,auVar42);
      *(undefined1 (*) [16])(ray + 0x80) = auVar41;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }